

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O3

void compute_response_layer_Dyy_leftcorner(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  bool *pbVar7;
  undefined1 auVar8 [16];
  float fVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  bool *pbVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  float *data;
  int iVar31;
  int iVar32;
  int width_5;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  float *pfVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  int data_width;
  
  auVar52 = in_ZMM20._0_16_;
  pfVar5 = layer->response;
  iVar1 = layer->filter_size;
  iVar2 = layer->step;
  pfVar6 = iimage->data;
  pbVar7 = layer->laplacian;
  iVar3 = iimage->data_width;
  fVar55 = 1.0 / (float)(iVar1 * iVar1);
  iVar10 = iVar1 / 3;
  iVar11 = iVar1 / 6;
  iVar4 = layer->width;
  iVar12 = (iVar1 + -1) - (iVar1 + -1 >> 0x1f) >> 1;
  iVar16 = layer->height;
  if (-6 < iVar1) {
    auVar52 = vxorps_avx512vl(auVar52,auVar52);
    iVar27 = 0;
    iVar13 = iVar10 + -1 + iVar3 * iVar12;
    iVar14 = iVar10 + -1 + ((iVar10 + -1) - iVar11) * iVar3;
    do {
      if (2 < iVar1) {
        iVar45 = iimage->width;
        iVar34 = iimage->height;
        iVar35 = iVar27 - iVar10;
        iVar46 = iVar35 + iVar10 * 2;
        iVar50 = iVar35 + 1;
        if (iVar34 < iVar35 + 1) {
          iVar50 = iVar34;
        }
        if (iVar34 <= iVar46) {
          iVar46 = iVar34;
        }
        iVar42 = (iVar50 + -1) * iVar3;
        iVar19 = (iVar46 + -1) * iVar3;
        if (iVar34 < iVar35) {
          iVar35 = iVar34;
        }
        lVar17 = (long)((iVar27 / iVar2) * iVar4);
        iVar48 = iVar34;
        if (iVar27 < iVar34) {
          iVar48 = iVar27;
        }
        iVar20 = (iVar35 + -1) * iVar3;
        iVar36 = (iVar48 + -1) * iVar3;
        iVar38 = iVar27 + 1;
        if (iVar34 < iVar27 + 1) {
          iVar38 = iVar34;
        }
        iVar21 = iVar27 + 1 + iVar10;
        if (iVar21 < iVar34) {
          iVar34 = iVar21;
        }
        iVar37 = (iVar38 + -1) * iVar3;
        iVar21 = (iVar34 + -1) * iVar3;
        lVar24 = 0;
        do {
          fVar56 = 0.0;
          fVar59 = 0.0;
          iVar26 = (int)lVar24;
          auVar62 = vfmadd213ss_fma(ZEXT416((uint)pfVar6[iVar14 + iVar26]),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)pfVar6[iVar13 + iVar26]));
          iVar22 = iVar26 - iVar12;
          if (iVar45 < iVar26 - iVar12) {
            iVar22 = iVar45;
          }
          iVar25 = (iVar1 - iVar12) + iVar26;
          if (iVar45 <= iVar25) {
            iVar25 = iVar45;
          }
          if ((0 < iVar50) && (0 < iVar22)) {
            fVar59 = pfVar6[iVar42 + iVar22 + -1];
          }
          if ((0 < iVar50) && (0 < iVar25)) {
            fVar56 = pfVar6[iVar42 + iVar25 + -1];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar46) && (0 < iVar22)) {
            fVar60 = pfVar6[iVar22 + -1 + iVar19];
          }
          if ((0 < iVar46) && (0 < iVar25)) {
            fVar58 = pfVar6[iVar25 + -1 + iVar19];
          }
          fVar61 = 0.0;
          iVar22 = iVar26 - iVar11;
          if (iVar45 < iVar26 - iVar11) {
            iVar22 = iVar45;
          }
          iVar25 = (iVar10 - iVar11) + iVar26;
          if (iVar45 <= iVar25) {
            iVar25 = iVar45;
          }
          if ((0 < iVar50) && (0 < iVar22)) {
            fVar61 = pfVar6[iVar42 + iVar22 + -1];
          }
          fVar63 = 0.0;
          if ((0 < iVar50) && (0 < iVar25)) {
            fVar63 = pfVar6[iVar42 + iVar25 + -1];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar46) && (0 < iVar22)) {
            fVar65 = pfVar6[iVar22 + -1 + iVar19];
          }
          if ((0 < iVar46) && (0 < iVar25)) {
            fVar64 = pfVar6[iVar25 + -1 + iVar19];
          }
          fVar57 = 0.0;
          iVar22 = iVar26 + 1;
          if (iVar45 < iVar26 + 1) {
            iVar22 = iVar45;
          }
          iVar32 = iVar22 + -1;
          iVar25 = iVar26 + 1 + iVar10;
          if (iVar45 <= iVar25) {
            iVar25 = iVar45;
          }
          auVar8 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar56) - fVar60) + fVar58)),
                              ZEXT816(0) << 0x40);
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                               ZEXT816(0) << 0x40);
          auVar8 = vfmadd132ss_fma(auVar53,auVar8,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar35) && (0 < iVar22)) {
            fVar59 = pfVar6[iVar20 + iVar32];
          }
          iVar47 = iVar25 + -1;
          if ((0 < iVar35) && (0 < iVar25)) {
            fVar57 = pfVar6[iVar20 + iVar47];
          }
          fVar60 = 0.0;
          fVar56 = 0.0;
          if ((0 < iVar48) && (0 < iVar22)) {
            fVar56 = pfVar6[iVar36 + iVar32];
          }
          if ((0 < iVar48) && (0 < iVar25)) {
            fVar60 = pfVar6[iVar36 + iVar47];
          }
          fVar58 = 0.0;
          iVar33 = iVar26 - iVar10;
          if (iVar45 < iVar26 - iVar10) {
            iVar33 = iVar45;
          }
          iVar43 = iVar33 + -1;
          iVar44 = iVar45;
          if (iVar26 < iVar45) {
            iVar44 = iVar26;
          }
          if ((0 < iVar38) && (0 < iVar33)) {
            fVar58 = pfVar6[iVar37 + iVar43];
          }
          iVar26 = iVar44 + -1;
          fVar61 = 0.0;
          if ((0 < iVar38) && (0 < iVar44)) {
            fVar61 = pfVar6[iVar37 + iVar26];
          }
          fVar65 = 0.0;
          fVar63 = 0.0;
          if ((0 < iVar34) && (0 < iVar33)) {
            fVar63 = pfVar6[iVar21 + iVar43];
          }
          if ((0 < iVar34) && (0 < iVar44)) {
            fVar65 = pfVar6[iVar21 + iVar26];
          }
          auVar53 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar53);
          if ((0 < iVar35) && (0 < iVar33)) {
            in_ZMM16 = ZEXT464((uint)pfVar6[iVar20 + iVar43]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar53);
          if ((0 < iVar35) && (0 < iVar44)) {
            in_ZMM17 = ZEXT464((uint)pfVar6[iVar20 + iVar26]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar53);
          if ((0 < iVar48) && (0 < iVar33)) {
            in_ZMM19 = ZEXT464((uint)pfVar6[iVar43 + iVar36]);
          }
          if ((0 < iVar48) && (0 < iVar44)) {
            in_ZMM18 = ZEXT464((uint)pfVar6[iVar26 + iVar36]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar53);
          if ((0 < iVar38) && (0 < iVar22)) {
            in_ZMM21 = ZEXT464((uint)pfVar6[iVar37 + iVar32]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar53);
          if ((0 < iVar38) && (0 < iVar25)) {
            in_ZMM22 = ZEXT464((uint)pfVar6[iVar37 + iVar47]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar53);
          if ((0 < iVar34) && (0 < iVar22)) {
            in_ZMM24 = ZEXT464((uint)pfVar6[iVar32 + iVar21]);
          }
          if ((0 < iVar34) && (0 < iVar25)) {
            in_ZMM23 = ZEXT464((uint)pfVar6[iVar47 + iVar21]);
          }
          fVar64 = fVar55 * auVar8._0_4_;
          fVar9 = fVar55 * auVar62._0_4_;
          auVar62 = vmaxss_avx(ZEXT416((uint)(fVar60 + ((fVar59 - fVar57) - fVar56))),
                               ZEXT816(0) << 0x40);
          auVar8 = vmaxss_avx(ZEXT416((uint)(fVar65 + ((fVar58 - fVar61) - fVar63))),
                              ZEXT816(0) << 0x40);
          auVar53 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar53 = vsubss_avx512f(auVar53,in_ZMM19._0_16_);
          auVar53 = vaddss_avx512f(auVar53,in_ZMM18._0_16_);
          auVar54 = vmaxss_avx512f(auVar53,auVar52);
          auVar53 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar53 = vsubss_avx512f(auVar53,in_ZMM24._0_16_);
          auVar53 = vaddss_avx512f(auVar53,in_ZMM23._0_16_);
          auVar53 = vmaxss_avx(auVar53,ZEXT816(0) << 0x40);
          fVar59 = fVar55 * (((auVar62._0_4_ + auVar8._0_4_) - auVar54._0_4_) - auVar53._0_4_);
          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar59 * -0.81)),ZEXT416((uint)fVar64),
                                    ZEXT416((uint)fVar9));
          pfVar5[lVar17] = auVar62._0_4_;
          pbVar7[lVar17] = 0.0 <= fVar9 + fVar64;
          lVar17 = lVar17 + 1;
          lVar24 = lVar24 + iVar2;
        } while (lVar24 < iVar10);
      }
      iVar13 = iVar13 + iVar2 * iVar3;
      iVar27 = iVar27 + iVar2;
      iVar14 = iVar14 + iVar2 * iVar3;
    } while (iVar27 <= iVar11);
  }
  iVar14 = iVar11 + iVar2;
  uVar28 = iVar14 % iVar2;
  iVar13 = iVar14 - uVar28;
  if (iVar13 <= iVar12) {
    auVar52 = vxorps_avx512vl(auVar52,auVar52);
    iVar27 = iVar10 + -1 + ((iVar12 + iVar14) - uVar28) * iVar3;
    iVar34 = iVar2 * iVar3;
    iVar45 = iVar10 + -1 + ((iVar14 + iVar10 + ~uVar28) - iVar11) * iVar3;
    iVar14 = iVar10 + -1 + ((~uVar28 + iVar14) - iVar11) * iVar3;
    do {
      if (2 < iVar1) {
        iVar50 = iimage->width;
        iVar46 = iimage->height;
        iVar42 = iVar13 - iVar10;
        iVar48 = (iVar13 / iVar2) * iVar4;
        iVar19 = iVar42 + iVar10 * 2;
        iVar35 = iVar42 + 1;
        if (iVar46 < iVar42 + 1) {
          iVar35 = iVar46;
        }
        if (iVar46 <= iVar19) {
          iVar19 = iVar46;
        }
        iVar20 = (iVar35 + -1) * iVar3;
        iVar38 = (iVar19 + -1) * iVar3;
        if (iVar46 < iVar42) {
          iVar42 = iVar46;
        }
        iVar36 = iVar46;
        if (iVar13 < iVar46) {
          iVar36 = iVar13;
        }
        iVar37 = (iVar42 + -1) * iVar3;
        iVar26 = (iVar36 + -1) * iVar3;
        iVar21 = iVar13 + 1;
        if (iVar46 < iVar13 + 1) {
          iVar21 = iVar46;
        }
        iVar22 = iVar13 + 1 + iVar10;
        if (iVar22 < iVar46) {
          iVar46 = iVar22;
        }
        iVar25 = (iVar21 + -1) * iVar3;
        lVar17 = 0;
        iVar22 = (iVar46 + -1) * iVar3;
        pfVar39 = pfVar5 + iVar48;
        pbVar18 = pbVar7 + iVar48;
        do {
          fVar56 = 0.0;
          fVar59 = 0.0;
          iVar48 = (int)lVar17;
          auVar62 = vfmadd213ss_fma(ZEXT416((uint)(pfVar6[iVar45 + iVar48] - pfVar6[iVar14 + iVar48]
                                                  )),SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)pfVar6[iVar27 + iVar48]));
          iVar32 = iVar48 - iVar12;
          if (iVar50 < iVar48 - iVar12) {
            iVar32 = iVar50;
          }
          iVar47 = (iVar1 - iVar12) + iVar48;
          if (iVar50 <= iVar47) {
            iVar47 = iVar50;
          }
          if ((0 < iVar35) && (0 < iVar32)) {
            fVar59 = pfVar6[iVar20 + iVar32 + -1];
          }
          if ((0 < iVar35) && (0 < iVar47)) {
            fVar56 = pfVar6[iVar20 + iVar47 + -1];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar19) && (0 < iVar32)) {
            fVar60 = pfVar6[iVar32 + -1 + iVar38];
          }
          if ((0 < iVar19) && (0 < iVar47)) {
            fVar58 = pfVar6[iVar47 + -1 + iVar38];
          }
          fVar61 = 0.0;
          iVar32 = iVar48 - iVar11;
          if (iVar50 < iVar48 - iVar11) {
            iVar32 = iVar50;
          }
          iVar47 = (iVar10 - iVar11) + iVar48;
          if (iVar50 <= iVar47) {
            iVar47 = iVar50;
          }
          if ((0 < iVar35) && (0 < iVar32)) {
            fVar61 = pfVar6[iVar20 + iVar32 + -1];
          }
          fVar63 = 0.0;
          if ((0 < iVar35) && (0 < iVar47)) {
            fVar63 = pfVar6[iVar20 + iVar47 + -1];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar19) && (0 < iVar32)) {
            fVar65 = pfVar6[iVar32 + -1 + iVar38];
          }
          if ((0 < iVar19) && (0 < iVar47)) {
            fVar64 = pfVar6[iVar47 + -1 + iVar38];
          }
          fVar57 = 0.0;
          iVar32 = iVar48 + 1;
          if (iVar50 < iVar48 + 1) {
            iVar32 = iVar50;
          }
          iVar33 = iVar32 + -1;
          iVar47 = iVar48 + 1 + iVar10;
          if (iVar50 <= iVar47) {
            iVar47 = iVar50;
          }
          auVar8 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar56) - fVar60) + fVar58)),
                              ZEXT816(0) << 0x40);
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                               ZEXT816(0) << 0x40);
          auVar8 = vfmadd132ss_fma(auVar53,auVar8,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar42) && (0 < iVar32)) {
            fVar59 = pfVar6[iVar37 + iVar33];
          }
          iVar44 = iVar47 + -1;
          if ((0 < iVar42) && (0 < iVar47)) {
            fVar57 = pfVar6[iVar37 + iVar44];
          }
          fVar60 = 0.0;
          fVar56 = 0.0;
          if ((0 < iVar36) && (0 < iVar32)) {
            fVar56 = pfVar6[iVar26 + iVar33];
          }
          if ((0 < iVar36) && (0 < iVar47)) {
            fVar60 = pfVar6[iVar26 + iVar44];
          }
          fVar58 = 0.0;
          iVar43 = iVar48 - iVar10;
          if (iVar50 < iVar48 - iVar10) {
            iVar43 = iVar50;
          }
          iVar31 = iVar50;
          if (iVar48 < iVar50) {
            iVar31 = iVar48;
          }
          iVar48 = iVar43 + -1;
          if ((0 < iVar21) && (0 < iVar43)) {
            fVar58 = pfVar6[iVar25 + iVar48];
          }
          iVar51 = iVar31 + -1;
          fVar61 = 0.0;
          if ((0 < iVar21) && (0 < iVar31)) {
            fVar61 = pfVar6[iVar25 + iVar51];
          }
          fVar65 = 0.0;
          fVar63 = 0.0;
          if ((0 < iVar46) && (0 < iVar43)) {
            fVar63 = pfVar6[iVar22 + iVar48];
          }
          if ((0 < iVar46) && (0 < iVar31)) {
            fVar65 = pfVar6[iVar22 + iVar51];
          }
          auVar53 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar53);
          if ((0 < iVar42) && (0 < iVar43)) {
            in_ZMM16 = ZEXT464((uint)pfVar6[iVar37 + iVar48]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar53);
          if ((0 < iVar42) && (0 < iVar31)) {
            in_ZMM17 = ZEXT464((uint)pfVar6[iVar37 + iVar51]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar53);
          if ((0 < iVar36) && (0 < iVar43)) {
            in_ZMM19 = ZEXT464((uint)pfVar6[iVar48 + iVar26]);
          }
          if ((0 < iVar36) && (0 < iVar31)) {
            in_ZMM18 = ZEXT464((uint)pfVar6[iVar51 + iVar26]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar53);
          if ((0 < iVar21) && (0 < iVar32)) {
            in_ZMM21 = ZEXT464((uint)pfVar6[iVar25 + iVar33]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar53);
          if ((0 < iVar21) && (0 < iVar47)) {
            in_ZMM22 = ZEXT464((uint)pfVar6[iVar25 + iVar44]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar53);
          if ((0 < iVar46) && (0 < iVar32)) {
            in_ZMM24 = ZEXT464((uint)pfVar6[iVar33 + iVar22]);
          }
          if ((0 < iVar46) && (0 < iVar47)) {
            in_ZMM23 = ZEXT464((uint)pfVar6[iVar44 + iVar22]);
          }
          fVar64 = fVar55 * auVar8._0_4_;
          fVar9 = fVar55 * auVar62._0_4_;
          auVar62 = vmaxss_avx(ZEXT416((uint)(fVar60 + ((fVar59 - fVar57) - fVar56))),
                               ZEXT816(0) << 0x40);
          auVar8 = vmaxss_avx(ZEXT416((uint)(fVar65 + ((fVar58 - fVar61) - fVar63))),
                              ZEXT816(0) << 0x40);
          auVar53 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar53 = vsubss_avx512f(auVar53,in_ZMM19._0_16_);
          auVar53 = vaddss_avx512f(auVar53,in_ZMM18._0_16_);
          auVar54 = vmaxss_avx512f(auVar53,auVar52);
          auVar53 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar53 = vsubss_avx512f(auVar53,in_ZMM24._0_16_);
          auVar53 = vaddss_avx512f(auVar53,in_ZMM23._0_16_);
          auVar53 = vmaxss_avx(auVar53,ZEXT816(0) << 0x40);
          fVar59 = fVar55 * (((auVar62._0_4_ + auVar8._0_4_) - auVar54._0_4_) - auVar53._0_4_);
          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar59 * -0.81)),ZEXT416((uint)fVar64),
                                    ZEXT416((uint)fVar9));
          *pfVar39 = auVar62._0_4_;
          *pbVar18 = 0.0 <= fVar9 + fVar64;
          lVar17 = lVar17 + iVar2;
          pfVar39 = pfVar39 + 1;
          pbVar18 = pbVar18 + 1;
        } while (lVar17 < iVar10);
      }
      iVar27 = iVar27 + iVar34;
      iVar13 = iVar13 + iVar2;
      iVar45 = iVar45 + iVar34;
      iVar14 = iVar14 + iVar34;
    } while (iVar13 <= iVar12);
  }
  iVar13 = (iVar10 + -1 + iVar2) / iVar2;
  if (-1 < iVar1) {
    auVar52 = vxorps_avx512vl(auVar52,auVar52);
    iVar14 = 0;
    iVar27 = iVar13 * iVar2;
    do {
      if (iVar27 < iVar4 * iVar2) {
        iVar45 = iimage->height;
        iVar46 = iVar14 - iVar10;
        iVar50 = iVar46 + iVar10 * 2;
        iVar34 = iVar46 + 1;
        if (iVar45 < iVar46 + 1) {
          iVar34 = iVar45;
        }
        if (iVar45 <= iVar50) {
          iVar50 = iVar45;
        }
        iVar19 = iVar14 - iVar12;
        iVar48 = (iVar34 + -1) * iVar3;
        iVar42 = (iVar50 + -1) * iVar3;
        iVar35 = iVar19;
        if (iVar45 < iVar19) {
          iVar35 = iVar45;
        }
        iVar38 = iVar19 + iVar1;
        if (iVar45 <= iVar19 + iVar1) {
          iVar38 = iVar45;
        }
        iVar21 = (iVar35 + -1) * iVar3;
        iVar20 = (iVar38 + -1) * iVar3;
        iVar36 = iVar14 - iVar11;
        iVar19 = iVar36;
        if (iVar45 < iVar36) {
          iVar19 = iVar45;
        }
        iVar37 = iVar36 + iVar10;
        if (iVar45 <= iVar36 + iVar10) {
          iVar37 = iVar45;
        }
        iVar26 = (iVar19 + -1) * iVar3;
        iVar36 = (iVar37 + -1) * iVar3;
        if (iVar45 < iVar46) {
          iVar46 = iVar45;
        }
        iVar22 = iVar45;
        if (iVar14 < iVar45) {
          iVar22 = iVar14;
        }
        iVar47 = (iVar46 + -1) * iVar3;
        iVar32 = iVar14 + 1 + iVar10;
        iVar33 = (iVar22 + -1) * iVar3;
        iVar25 = iVar14 + 1;
        if (iVar45 < iVar14 + 1) {
          iVar25 = iVar45;
        }
        if (iVar32 < iVar45) {
          iVar45 = iVar32;
        }
        iVar43 = (iVar25 + -1) * iVar3;
        lVar17 = (long)((iVar14 / iVar2) * iVar4 + iVar13);
        iVar31 = (iVar45 + -1) * iVar3;
        iVar32 = iimage->width;
        iVar44 = iVar27;
        do {
          fVar56 = 0.0;
          fVar59 = 0.0;
          iVar51 = iVar44 - iVar12;
          if (iVar32 < iVar44 - iVar12) {
            iVar51 = iVar32;
          }
          iVar15 = (iVar1 - iVar12) + iVar44;
          if (iVar32 <= iVar15) {
            iVar15 = iVar32;
          }
          if ((0 < iVar34) && (0 < iVar51)) {
            fVar59 = pfVar6[iVar48 + iVar51 + -1];
          }
          if ((0 < iVar34) && (0 < iVar15)) {
            fVar56 = pfVar6[iVar48 + iVar15 + -1];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar50) && (0 < iVar51)) {
            fVar60 = pfVar6[iVar51 + -1 + iVar42];
          }
          if ((0 < iVar50) && (0 < iVar15)) {
            fVar58 = pfVar6[iVar15 + -1 + iVar42];
          }
          auVar62 = ZEXT816(0) << 0x40;
          fVar61 = 0.0;
          iVar51 = iVar44 - iVar11;
          if (iVar32 < iVar44 - iVar11) {
            iVar51 = iVar32;
          }
          iVar15 = (iVar10 - iVar11) + iVar44;
          if (iVar32 <= iVar15) {
            iVar15 = iVar32;
          }
          if ((0 < iVar34) && (0 < iVar51)) {
            fVar61 = pfVar6[iVar48 + iVar51 + -1];
          }
          fVar63 = 0.0;
          if ((0 < iVar34) && (0 < iVar15)) {
            fVar63 = pfVar6[iVar48 + iVar15 + -1];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar50) && (0 < iVar51)) {
            fVar65 = pfVar6[iVar51 + -1 + iVar42];
          }
          if ((0 < iVar50) && (0 < iVar15)) {
            fVar64 = pfVar6[iVar15 + -1 + iVar42];
          }
          fVar57 = 0.0;
          iVar51 = -iVar10 + 1 + iVar44;
          if (iVar32 < iVar51) {
            iVar51 = iVar32;
          }
          auVar8 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar56) - fVar60) + fVar58)),auVar62);
          iVar49 = iVar51 + -1;
          iVar15 = iVar10 + iVar44;
          if (iVar32 <= iVar10 + iVar44) {
            iVar15 = iVar32;
          }
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                               ZEXT816(0) << 0x40);
          auVar8 = vfmadd132ss_fma(auVar53,auVar8,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar35) && (0 < iVar51)) {
            fVar59 = pfVar6[iVar21 + iVar49];
          }
          iVar23 = iVar15 + -1;
          if ((0 < iVar35) && (0 < iVar15)) {
            fVar57 = pfVar6[iVar21 + iVar23];
          }
          fVar60 = 0.0;
          fVar56 = 0.0;
          if ((0 < iVar38) && (0 < iVar51)) {
            fVar56 = pfVar6[iVar20 + iVar49];
          }
          if ((0 < iVar38) && (0 < iVar15)) {
            fVar60 = pfVar6[iVar20 + iVar23];
          }
          if ((0 < iVar19) && (0 < iVar51)) {
            auVar62 = ZEXT416((uint)pfVar6[iVar26 + iVar49]);
          }
          fVar58 = 0.0;
          if ((0 < iVar19) && (0 < iVar15)) {
            fVar58 = pfVar6[iVar26 + iVar23];
          }
          fVar63 = 0.0;
          fVar61 = 0.0;
          if ((0 < iVar37) && (0 < iVar51)) {
            fVar61 = pfVar6[iVar49 + iVar36];
          }
          if ((0 < iVar37) && (0 < iVar15)) {
            fVar63 = pfVar6[iVar23 + iVar36];
          }
          fVar65 = 0.0;
          iVar51 = iVar44 + 1;
          if (iVar32 < iVar44 + 1) {
            iVar51 = iVar32;
          }
          iVar49 = iVar51 + -1;
          iVar15 = iVar44 + 1 + iVar10;
          if (iVar32 <= iVar15) {
            iVar15 = iVar32;
          }
          auVar53 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar57) - fVar56) + fVar60)),
                               ZEXT816(0) << 0x40);
          auVar62 = vmaxss_avx(ZEXT416((uint)(fVar63 + ((auVar62._0_4_ - fVar58) - fVar61))),
                               ZEXT816(0) << 0x40);
          auVar62 = vfmadd132ss_fma(auVar62,auVar53,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar46) && (0 < iVar51)) {
            fVar59 = pfVar6[iVar47 + iVar49];
          }
          iVar23 = iVar15 + -1;
          if ((0 < iVar46) && (0 < iVar15)) {
            fVar65 = pfVar6[iVar47 + iVar23];
          }
          fVar60 = 0.0;
          fVar56 = 0.0;
          if ((0 < iVar22) && (0 < iVar51)) {
            fVar56 = pfVar6[iVar33 + iVar49];
          }
          if ((0 < iVar22) && (0 < iVar15)) {
            fVar60 = pfVar6[iVar33 + iVar23];
          }
          fVar58 = 0.0;
          iVar40 = -iVar10 + iVar44;
          if (iVar32 < iVar40) {
            iVar40 = iVar32;
          }
          iVar41 = iVar40 + -1;
          iVar30 = iVar32;
          if (iVar44 < iVar32) {
            iVar30 = iVar44;
          }
          if ((0 < iVar25) && (0 < iVar40)) {
            fVar58 = pfVar6[iVar43 + iVar41];
          }
          iVar29 = iVar30 + -1;
          fVar61 = 0.0;
          if ((0 < iVar25) && (0 < iVar30)) {
            fVar61 = pfVar6[iVar43 + iVar29];
          }
          fVar64 = 0.0;
          fVar63 = 0.0;
          if ((0 < iVar45) && (0 < iVar40)) {
            fVar63 = pfVar6[iVar31 + iVar41];
          }
          if ((0 < iVar45) && (0 < iVar30)) {
            fVar64 = pfVar6[iVar31 + iVar29];
          }
          auVar53 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar53);
          if ((0 < iVar46) && (0 < iVar40)) {
            in_ZMM16 = ZEXT464((uint)pfVar6[iVar47 + iVar41]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar53);
          if ((0 < iVar46) && (0 < iVar30)) {
            in_ZMM17 = ZEXT464((uint)pfVar6[iVar47 + iVar29]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar53);
          if ((0 < iVar22) && (0 < iVar40)) {
            in_ZMM19 = ZEXT464((uint)pfVar6[iVar41 + iVar33]);
          }
          if ((0 < iVar22) && (0 < iVar30)) {
            in_ZMM18 = ZEXT464((uint)pfVar6[iVar29 + iVar33]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar53);
          if ((0 < iVar25) && (0 < iVar51)) {
            in_ZMM21 = ZEXT464((uint)pfVar6[iVar43 + iVar49]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar53);
          if ((0 < iVar25) && (0 < iVar15)) {
            in_ZMM22 = ZEXT464((uint)pfVar6[iVar43 + iVar23]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar53);
          if ((0 < iVar45) && (0 < iVar51)) {
            in_ZMM24 = ZEXT464((uint)pfVar6[iVar49 + iVar31]);
          }
          if ((0 < iVar45) && (0 < iVar15)) {
            in_ZMM23 = ZEXT464((uint)pfVar6[iVar23 + iVar31]);
          }
          fVar57 = fVar55 * auVar8._0_4_;
          fVar9 = fVar55 * auVar62._0_4_;
          auVar62 = vmaxss_avx(ZEXT416((uint)(fVar60 + ((fVar59 - fVar65) - fVar56))),
                               ZEXT816(0) << 0x40);
          auVar8 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar58 - fVar61) - fVar63))),
                              ZEXT816(0) << 0x40);
          auVar53 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar53 = vsubss_avx512f(auVar53,in_ZMM19._0_16_);
          auVar53 = vaddss_avx512f(auVar53,in_ZMM18._0_16_);
          auVar54 = vmaxss_avx512f(auVar53,auVar52);
          auVar53 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar53 = vsubss_avx512f(auVar53,in_ZMM24._0_16_);
          auVar53 = vaddss_avx512f(auVar53,in_ZMM23._0_16_);
          auVar53 = vmaxss_avx(auVar53,ZEXT816(0) << 0x40);
          fVar59 = fVar55 * (((auVar62._0_4_ + auVar8._0_4_) - auVar54._0_4_) - auVar53._0_4_);
          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar59 * -0.81)),ZEXT416((uint)fVar57),
                                    ZEXT416((uint)fVar9));
          pfVar5[lVar17] = auVar62._0_4_;
          pbVar7[lVar17] = 0.0 <= fVar57 + fVar9;
          lVar17 = lVar17 + 1;
          iVar44 = iVar44 + iVar2;
        } while (iVar44 < iVar4 * iVar2);
      }
      iVar14 = iVar14 + iVar2;
    } while (iVar14 <= iVar12);
  }
  iVar13 = (iVar12 + iVar2) - (iVar12 + iVar2) % iVar2;
  iVar16 = iVar16 * iVar2;
  if (iVar13 < iVar16) {
    auVar52 = vxorps_avx512vl(auVar52,auVar52);
    do {
      if (0 < iVar4 * iVar2) {
        iVar14 = iimage->height;
        iVar34 = iVar13 - iVar10;
        iVar45 = iVar34 + iVar10 * 2;
        iVar27 = iVar34 + 1;
        if (iVar14 < iVar34 + 1) {
          iVar27 = iVar14;
        }
        if (iVar14 <= iVar45) {
          iVar45 = iVar14;
        }
        iVar19 = (iVar27 + -1) * iVar3;
        iVar46 = (iVar45 + -1) * iVar3;
        lVar17 = (long)((iVar13 / iVar2) * iVar4);
        iVar35 = iVar13 - iVar12;
        iVar50 = iVar35;
        if (iVar14 < iVar35) {
          iVar50 = iVar14;
        }
        iVar42 = iVar35 + iVar1;
        if (iVar14 <= iVar35 + iVar1) {
          iVar42 = iVar14;
        }
        iVar20 = (iVar50 + -1) * iVar3;
        iVar48 = (iVar42 + -1) * iVar3;
        iVar38 = iVar13 - iVar11;
        iVar35 = iVar38;
        if (iVar14 < iVar38) {
          iVar35 = iVar14;
        }
        iVar21 = iVar13 + 1 + iVar10;
        iVar36 = iVar38 + iVar10;
        if (iVar14 <= iVar38 + iVar10) {
          iVar36 = iVar14;
        }
        iVar37 = (iVar35 + -1) * iVar3;
        iVar38 = (iVar36 + -1) * iVar3;
        if (iVar14 < iVar34) {
          iVar34 = iVar14;
        }
        iVar26 = iVar14;
        if (iVar13 < iVar14) {
          iVar26 = iVar13;
        }
        iVar25 = (iVar34 + -1) * iVar3;
        iVar32 = (iVar26 + -1) * iVar3;
        iVar22 = iVar13 + 1;
        if (iVar14 < iVar13 + 1) {
          iVar22 = iVar14;
        }
        if (iVar21 < iVar14) {
          iVar14 = iVar21;
        }
        iVar21 = iimage->width;
        iVar44 = 0;
        iVar47 = (iVar22 + -1) * iVar3;
        iVar33 = (iVar14 + -1) * iVar3;
        do {
          fVar56 = 0.0;
          fVar59 = 0.0;
          iVar31 = (iVar1 - iVar12) + iVar44;
          iVar43 = iVar44 - iVar12;
          if (iVar21 < iVar44 - iVar12) {
            iVar43 = iVar21;
          }
          if (iVar21 <= iVar31) {
            iVar31 = iVar21;
          }
          if ((0 < iVar27) && (0 < iVar43)) {
            fVar59 = pfVar6[iVar19 + iVar43 + -1];
          }
          if ((0 < iVar27) && (0 < iVar31)) {
            fVar56 = pfVar6[iVar19 + iVar31 + -1];
          }
          fVar58 = 0.0;
          fVar60 = 0.0;
          if ((0 < iVar45) && (0 < iVar43)) {
            fVar60 = pfVar6[iVar43 + -1 + iVar46];
          }
          if ((0 < iVar45) && (0 < iVar31)) {
            fVar58 = pfVar6[iVar31 + -1 + iVar46];
          }
          auVar62 = ZEXT816(0) << 0x40;
          fVar61 = 0.0;
          iVar31 = (iVar10 - iVar11) + iVar44;
          iVar43 = iVar44 - iVar11;
          if (iVar21 < iVar44 - iVar11) {
            iVar43 = iVar21;
          }
          if (iVar21 <= iVar31) {
            iVar31 = iVar21;
          }
          if ((0 < iVar27) && (0 < iVar43)) {
            fVar61 = pfVar6[iVar19 + iVar43 + -1];
          }
          fVar63 = 0.0;
          if ((0 < iVar27) && (0 < iVar31)) {
            fVar63 = pfVar6[iVar19 + iVar31 + -1];
          }
          fVar64 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar45) && (0 < iVar43)) {
            fVar65 = pfVar6[iVar43 + -1 + iVar46];
          }
          if ((0 < iVar45) && (0 < iVar31)) {
            fVar64 = pfVar6[iVar31 + -1 + iVar46];
          }
          iVar43 = -iVar10 + 1 + iVar44;
          fVar57 = 0.0;
          if (iVar21 < iVar43) {
            iVar43 = iVar21;
          }
          iVar51 = iVar43 + -1;
          iVar31 = iVar10 + iVar44;
          if (iVar21 <= iVar10 + iVar44) {
            iVar31 = iVar21;
          }
          auVar8 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar56) - fVar60) + fVar58)),auVar62);
          auVar53 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar61 - fVar63) - fVar65))),
                               ZEXT816(0) << 0x40);
          auVar8 = vfmadd132ss_fma(auVar53,auVar8,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar50) && (0 < iVar43)) {
            fVar59 = pfVar6[iVar20 + iVar51];
          }
          iVar15 = iVar31 + -1;
          if ((0 < iVar50) && (0 < iVar31)) {
            fVar57 = pfVar6[iVar20 + iVar15];
          }
          fVar60 = 0.0;
          fVar56 = 0.0;
          if ((0 < iVar42) && (0 < iVar43)) {
            fVar56 = pfVar6[iVar48 + iVar51];
          }
          if ((0 < iVar42) && (0 < iVar31)) {
            fVar60 = pfVar6[iVar48 + iVar15];
          }
          if ((0 < iVar35) && (0 < iVar43)) {
            auVar62 = ZEXT416((uint)pfVar6[iVar37 + iVar51]);
          }
          fVar58 = 0.0;
          if ((0 < iVar35) && (0 < iVar31)) {
            fVar58 = pfVar6[iVar37 + iVar15];
          }
          fVar63 = 0.0;
          fVar61 = 0.0;
          if ((0 < iVar36) && (0 < iVar43)) {
            fVar61 = pfVar6[iVar51 + iVar38];
          }
          if ((0 < iVar36) && (0 < iVar31)) {
            fVar63 = pfVar6[iVar15 + iVar38];
          }
          fVar65 = 0.0;
          iVar43 = iVar44 + 1;
          if (iVar21 < iVar44 + 1) {
            iVar43 = iVar21;
          }
          iVar51 = iVar43 + -1;
          iVar31 = iVar44 + 1 + iVar10;
          if (iVar21 <= iVar31) {
            iVar31 = iVar21;
          }
          auVar53 = vmaxss_avx(ZEXT416((uint)(((fVar59 - fVar57) - fVar56) + fVar60)),
                               ZEXT816(0) << 0x40);
          auVar62 = vmaxss_avx(ZEXT416((uint)(fVar63 + ((auVar62._0_4_ - fVar58) - fVar61))),
                               ZEXT816(0) << 0x40);
          auVar62 = vfmadd132ss_fma(auVar62,auVar53,SUB6416(ZEXT464(0xc0400000),0));
          fVar59 = 0.0;
          if ((0 < iVar34) && (0 < iVar43)) {
            fVar59 = pfVar6[iVar25 + iVar51];
          }
          iVar15 = iVar31 + -1;
          if ((0 < iVar34) && (0 < iVar31)) {
            fVar65 = pfVar6[iVar25 + iVar15];
          }
          fVar60 = 0.0;
          fVar56 = 0.0;
          if ((0 < iVar26) && (0 < iVar43)) {
            fVar56 = pfVar6[iVar32 + iVar51];
          }
          if ((0 < iVar26) && (0 < iVar31)) {
            fVar60 = pfVar6[iVar32 + iVar15];
          }
          iVar49 = -iVar10 + iVar44;
          fVar58 = 0.0;
          if (iVar21 < iVar49) {
            iVar49 = iVar21;
          }
          iVar23 = iVar21;
          if (iVar44 < iVar21) {
            iVar23 = iVar44;
          }
          iVar40 = iVar49 + -1;
          if ((0 < iVar22) && (0 < iVar49)) {
            fVar58 = pfVar6[iVar47 + iVar40];
          }
          iVar30 = iVar23 + -1;
          fVar61 = 0.0;
          if ((0 < iVar22) && (0 < iVar23)) {
            fVar61 = pfVar6[iVar47 + iVar30];
          }
          fVar64 = 0.0;
          fVar63 = 0.0;
          if ((0 < iVar14) && (0 < iVar49)) {
            fVar63 = pfVar6[iVar33 + iVar40];
          }
          if ((0 < iVar14) && (0 < iVar23)) {
            fVar64 = pfVar6[iVar33 + iVar30];
          }
          auVar53 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar53);
          if ((0 < iVar34) && (0 < iVar49)) {
            in_ZMM16 = ZEXT464((uint)pfVar6[iVar25 + iVar40]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar53);
          if ((0 < iVar34) && (0 < iVar23)) {
            in_ZMM17 = ZEXT464((uint)pfVar6[iVar25 + iVar30]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar53);
          if ((0 < iVar26) && (0 < iVar49)) {
            in_ZMM19 = ZEXT464((uint)pfVar6[iVar40 + iVar32]);
          }
          if ((0 < iVar26) && (0 < iVar23)) {
            in_ZMM18 = ZEXT464((uint)pfVar6[iVar30 + iVar32]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar53);
          if ((0 < iVar22) && (0 < iVar43)) {
            in_ZMM21 = ZEXT464((uint)pfVar6[iVar47 + iVar51]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar53);
          if ((0 < iVar22) && (0 < iVar31)) {
            in_ZMM22 = ZEXT464((uint)pfVar6[iVar47 + iVar15]);
          }
          auVar53 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar53);
          auVar53 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar53);
          if ((0 < iVar14) && (0 < iVar43)) {
            in_ZMM24 = ZEXT464((uint)pfVar6[iVar51 + iVar33]);
          }
          if ((0 < iVar14) && (0 < iVar31)) {
            in_ZMM23 = ZEXT464((uint)pfVar6[iVar15 + iVar33]);
          }
          fVar57 = fVar55 * auVar8._0_4_;
          fVar9 = fVar55 * auVar62._0_4_;
          auVar62 = vmaxss_avx(ZEXT416((uint)(fVar60 + ((fVar59 - fVar65) - fVar56))),
                               ZEXT816(0) << 0x40);
          auVar8 = vmaxss_avx(ZEXT416((uint)(fVar64 + ((fVar58 - fVar61) - fVar63))),
                              ZEXT816(0) << 0x40);
          auVar53 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar53 = vsubss_avx512f(auVar53,in_ZMM19._0_16_);
          auVar53 = vaddss_avx512f(auVar53,in_ZMM18._0_16_);
          auVar54 = vmaxss_avx512f(auVar53,auVar52);
          auVar53 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar53 = vsubss_avx512f(auVar53,in_ZMM24._0_16_);
          auVar53 = vaddss_avx512f(auVar53,in_ZMM23._0_16_);
          auVar53 = vmaxss_avx(auVar53,ZEXT816(0) << 0x40);
          fVar59 = fVar55 * (((auVar62._0_4_ + auVar8._0_4_) - auVar54._0_4_) - auVar53._0_4_);
          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar59 * -0.81)),ZEXT416((uint)fVar57),
                                    ZEXT416((uint)fVar9));
          pfVar5[lVar17] = auVar62._0_4_;
          pbVar7[lVar17] = 0.0 <= fVar57 + fVar9;
          lVar17 = lVar17 + 1;
          iVar44 = iVar44 + iVar2;
        } while (iVar44 < iVar4 * iVar2);
      }
      iVar13 = iVar13 + iVar2;
    } while (iVar13 < iVar16);
  }
  return;
}

Assistant:

void compute_response_layer_Dyy_leftcorner(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer

        optimization:
        - Dyy box filter hand optimized and split into cases (here only leftcorner)
    */
    float Dxx, Dyy, Dxy;
    int x, y;
    int r0, r1, c0, c1, r00, r01, c00, c01, r10, r11, c10, c11;
    float Dyy0, Dyy1;
    float A, B, C, D;
    int k;

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size * filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float *) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    /*
        In our optimized function, i and j are raw coordinates in the integral
        / original image. In the original function these coordinates are
        coordinates of the layer. We changed it this way in the optimized function
        because its easier to about corner cases in raw coordinates.
    */

    // Top Left Corner - Case 1: B of neg part outside
    for (int i = 0; i < lobe / 2 + 1; i += step) {  // Inner B is outside, i.e. 0
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {  // c0 = col - 1 = (y - lobe + 1) -1 < 0
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];  // seg fault at: i: 12, j:0

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;  // -1 is already part of r10
            c11 = y + lobe - 1;

            D = data[r11 * data_width + c11];
            Dyy1 = D;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Left Corner - Case 2: B of neg part inside
    // initial value has to be rounded up to next bigger step
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border + 1; i += step) {  // Inner B is inside
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // -1 is already part of r10
            c11 = y + lobe - 1;

            B = data[r10 * data_width + c11];
            D = data[r11 * data_width + c11];
            Dyy1 = D - B;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (lobe + step - 1) / step * step;

    for (int i = 0; i < border + 1; i += step) {
        ind = (i / step) * width + (k / step);

        for (int j = k; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // printf("OPTIMIZED: (%i, %i) - Dyy: %f, Dxx: %f, Dxy: %f\n\n", i, j, Dyy, Dxx, Dxy);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    k = (border + 1 + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}